

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

bool __thiscall
Inferences::InductionClauseIterator::isValidBound
          (InductionClauseIterator *this,InductionContext *context,Bound *bound)

{
  _Hash_node_base _Var1;
  Term *t;
  Term *pTVar2;
  __node_base *p_Var3;
  Literal **lit;
  _Hash_node_base _Var4;
  
  t = getPlaceholderForTerm(&context->_indTerms,0);
  p_Var3 = &(context->_cls)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var3[4]._M_nxt;
    for (_Var4._M_nxt = p_Var3[3]._M_nxt; _Var4._M_nxt != _Var1._M_nxt;
        _Var4._M_nxt = _Var4._M_nxt + 1) {
      pTVar2 = InductionHelper::getOtherTermFromComparison((Literal *)(_Var4._M_nxt)->_M_nxt,t);
      if ((((undefined1  [36])((undefined1  [36])bound->_inner & (undefined1  [36])0x1) ==
            (undefined1  [36])0x0) &&
          (*(_Hash_node_base **)((bound->_inner)._content + 0x18) == p_Var3[1]._M_nxt)) ||
         (pTVar2 == *(Term **)(bound->_inner)._content)) goto LAB_003f7b71;
    }
  }
LAB_003f7b71:
  return p_Var3 == (__node_base *)0x0;
}

Assistant:

bool InductionClauseIterator::isValidBound(const InductionContext& context, const Bound& bound)
{
  ASS_EQ(context._indTerms.size(), 1);
  Term* pt = getPlaceholderForTerm(context._indTerms,0);
  for (const auto& kv : context._cls) {
    for (const auto& lit : kv.second) {
      ASS((lit != nullptr) && (kv.first != nullptr));
      Term* otherArg = InductionHelper::getOtherTermFromComparison(lit, pt);
      if (!bound.match(
            [&](TermLiteralClause const&  bound) 
            { return InductionHelper::isValidBound(otherArg, kv.first, bound); },
            [&](DefaultBound const& bound) 
            { return InductionHelper::isValidForDefaultBound(otherArg, kv.first, bound.term); }
            )) {
        return false;
      }
    }
  }
  return true;
}